

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzip2recover.c
# Opt level: O0

Int32 main(Int32 argc,Char **argv)

{
  Bool BVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  FILE *pFVar5;
  BitStream *pBVar6;
  MaybeUInt64 MVar7;
  char *pcVar8;
  uint uVar9;
  int local_78;
  Int32 k;
  Int32 ofs;
  Char *split;
  Char *p;
  uint local_58;
  UInt32 blockCRC;
  UInt32 buffLo;
  UInt32 buffHi;
  MaybeUInt64 bitsRead;
  Int32 rbCtr;
  Int32 currBlock;
  Int32 wrBlock;
  Int32 b;
  BitStream *bsWr;
  BitStream *bsIn;
  FILE *outFile;
  FILE *inFile;
  Char **argv_local;
  Int32 argc_local;
  
  strncpy(progName,*argv,1999);
  progName[1999] = '\0';
  outFileName[0] = '\0';
  inFileName[0] = '\0';
  fprintf(_stderr,"bzip2recover 1.0.6: extracts blocks from damaged .bz2 files.\n");
  if (argc != 2) {
    fprintf(_stderr,"%s: usage is `%s damaged_file_name\'.\n",progName);
    fprintf(_stderr,"\trestrictions on size of recovered file: None\n");
    exit(1);
  }
  sVar4 = strlen(argv[1]);
  pFVar5 = _stderr;
  if (0x7bb < sVar4) {
    sVar4 = strlen(argv[1]);
    fprintf(pFVar5,"%s: supplied filename is suspiciously (>= %d chars) long.  Bye!\n",progName,
            sVar4 & 0xffffffff);
    exit(1);
  }
  strcpy(inFileName,argv[1]);
  pFVar5 = fopen(inFileName,"rb");
  if (pFVar5 == (FILE *)0x0) {
    fprintf(_stderr,"%s: can\'t read `%s\'\n",progName,inFileName);
    exit(1);
  }
  pBVar6 = bsOpenReadStream((FILE *)pFVar5);
  fprintf(_stderr,"%s: searching for block boundaries ...\n",progName);
  _buffLo = 0;
  local_58 = 0;
  blockCRC = 0;
  bitsRead._4_4_ = 0;
  bStart[0] = 0;
  bitsRead._0_4_ = 0;
  MVar7 = _buffLo;
  while( true ) {
    _buffLo = MVar7;
    uVar2 = bsGetBit(pBVar6);
    MVar7 = _buffLo + 1;
    if (uVar2 == 2) break;
    uVar3 = blockCRC << 1;
    uVar9 = local_58 >> 0x1f;
    blockCRC = uVar3 | uVar9;
    local_58 = local_58 << 1 | uVar2 & 1;
    if ((((uVar3 & 0xffff | uVar9) == 0x3141) && (local_58 == 0x59265359)) ||
       (((uVar3 & 0xffff | uVar9) == 0x1772 && (local_58 == 0x45385090)))) {
      if (MVar7 < 0x32) {
        bEnd[(int)bitsRead._4_4_] = 0;
      }
      else {
        bEnd[(int)bitsRead._4_4_] = _buffLo - 0x30;
      }
      if ((0 < (int)bitsRead._4_4_) &&
         (0x81 < bEnd[(int)bitsRead._4_4_] - bStart[(int)bitsRead._4_4_])) {
        fprintf(_stderr,"   block %d runs from %Lu to %Lu\n",(ulong)((int)bitsRead + 1),
                bStart[(int)bitsRead._4_4_],bEnd[(int)bitsRead._4_4_]);
        rbStart[(int)bitsRead] = bStart[(int)bitsRead._4_4_];
        rbEnd[(int)bitsRead] = bEnd[(int)bitsRead._4_4_];
        bitsRead._0_4_ = (int)bitsRead + 1;
      }
      if (49999 < (int)bitsRead._4_4_) {
        tooManyBlocks(50000);
      }
      bitsRead._4_4_ = bitsRead._4_4_ + 1;
      bStart[(int)bitsRead._4_4_] = MVar7;
    }
  }
  if (((bStart[(int)bitsRead._4_4_] <= MVar7) && (0x27 < MVar7 - bStart[(int)bitsRead._4_4_])) &&
     (bEnd[(int)bitsRead._4_4_] = _buffLo, 0 < (int)bitsRead._4_4_)) {
    fprintf(_stderr,"   block %d runs from %Lu to %Lu (incomplete)\n",(ulong)bitsRead._4_4_,
            bStart[(int)bitsRead._4_4_],bEnd[(int)bitsRead._4_4_]);
  }
  bsClose(pBVar6);
  if ((int)bitsRead < 1) {
    fprintf(_stderr,"%s: sorry, I couldn\'t find any block boundaries.\n",progName);
    exit(1);
  }
  fprintf(_stderr,"%s: splitting into blocks\n",progName);
  pFVar5 = fopen(inFileName,"rb");
  if (pFVar5 == (FILE *)0x0) {
    fprintf(_stderr,"%s: can\'t open `%s\'\n",progName,inFileName);
    exit(1);
  }
  pBVar6 = bsOpenReadStream((FILE *)pFVar5);
  p._4_4_ = 0;
  _wrBlock = (BitStream *)0x0;
  _buffLo = 0;
  bsIn = (BitStream *)0x0;
  rbCtr = 0;
  while (uVar2 = bsGetBit(pBVar6), uVar2 != 2) {
    blockCRC = blockCRC << 1 | local_58 >> 0x1f;
    uVar3 = local_58 << 1;
    local_58 = uVar3 | uVar2 & 1;
    if (_buffLo == rbStart[rbCtr] + 0x2f) {
      p._4_4_ = blockCRC << 0x10 | uVar3 >> 0x10;
    }
    if (((bsIn != (BitStream *)0x0) && (rbStart[rbCtr] <= _buffLo)) && (_buffLo <= rbEnd[rbCtr])) {
      bsPutBit(_wrBlock,uVar2);
    }
    _buffLo = _buffLo + 1;
    if (_buffLo == rbEnd[rbCtr] + 1) {
      if (bsIn != (BitStream *)0x0) {
        bsPutUChar(_wrBlock,'\x17');
        bsPutUChar(_wrBlock,'r');
        bsPutUChar(_wrBlock,'E');
        bsPutUChar(_wrBlock,'8');
        bsPutUChar(_wrBlock,'P');
        bsPutUChar(_wrBlock,0x90);
        bsPutUInt32(_wrBlock,p._4_4_);
        bsClose(_wrBlock);
      }
      if ((int)bitsRead <= rbCtr) break;
      rbCtr = rbCtr + 1;
    }
    else if (_buffLo == rbStart[rbCtr]) {
      for (local_78 = 0; local_78 < 2000; local_78 = local_78 + 1) {
        outFileName[local_78] = '\0';
      }
      strcpy(outFileName,inFileName);
      pcVar8 = strrchr(outFileName,0x2f);
      if (pcVar8 == (char *)0x0) {
        _k = outFileName;
      }
      else {
        _k = pcVar8 + 1;
      }
      sprintf(_k,"rec%5d",(ulong)(rbCtr + 1));
      for (split = _k; *split != '\0'; split = split + 1) {
        if (*split == ' ') {
          *split = '0';
        }
      }
      strcat(outFileName,inFileName + ((int)_k + -0x1058a0));
      BVar1 = endsInBz2(outFileName);
      if (BVar1 == '\0') {
        strcat(outFileName,".bz2");
      }
      fprintf(_stderr,"   writing block %d to `%s\' ...\n",(ulong)(rbCtr + 1),outFileName);
      bsIn = (BitStream *)fopen(outFileName,"wb");
      if ((FILE *)bsIn == (FILE *)0x0) {
        fprintf(_stderr,"%s: can\'t write `%s\'\n",progName,outFileName);
        exit(1);
      }
      _wrBlock = bsOpenWriteStream((FILE *)bsIn);
      bsPutUChar(_wrBlock,'B');
      bsPutUChar(_wrBlock,'Z');
      bsPutUChar(_wrBlock,'h');
      bsPutUChar(_wrBlock,'9');
      bsPutUChar(_wrBlock,'1');
      bsPutUChar(_wrBlock,'A');
      bsPutUChar(_wrBlock,'Y');
      bsPutUChar(_wrBlock,'&');
      bsPutUChar(_wrBlock,'S');
      bsPutUChar(_wrBlock,'Y');
    }
  }
  fprintf(_stderr,"%s: finished\n",progName);
  return 0;
}

Assistant:

Int32 main ( Int32 argc, Char** argv )
{
   FILE*       inFile;
   FILE*       outFile;
   BitStream*  bsIn, *bsWr;
   Int32       b, wrBlock, currBlock, rbCtr;
   MaybeUInt64 bitsRead;

   UInt32      buffHi, buffLo, blockCRC;
   Char*       p;

   strncpy ( progName, argv[0], BZ_MAX_FILENAME-1);
   progName[BZ_MAX_FILENAME-1]='\0';
   inFileName[0] = outFileName[0] = 0;

   fprintf ( stderr, 
             "bzip2recover 1.0.6: extracts blocks from damaged .bz2 files.\n" );

   if (argc != 2) {
      fprintf ( stderr, "%s: usage is `%s damaged_file_name'.\n",
                        progName, progName );
      switch (sizeof(MaybeUInt64)) {
         case 8:
            fprintf(stderr, 
                    "\trestrictions on size of recovered file: None\n");
            break;
         case 4:
            fprintf(stderr, 
                    "\trestrictions on size of recovered file: 512 MB\n");
            fprintf(stderr, 
                    "\tto circumvent, recompile with MaybeUInt64 as an\n"
                    "\tunsigned 64-bit int.\n");
            break;
         default:
            fprintf(stderr, 
                    "\tsizeof(MaybeUInt64) is not 4 or 8 -- "
                    "configuration error.\n");
            break;
      }
      exit(1);
   }

   if (strlen(argv[1]) >= BZ_MAX_FILENAME-20) {
      fprintf ( stderr, 
                "%s: supplied filename is suspiciously (>= %d chars) long.  Bye!\n",
                progName, (int)strlen(argv[1]) );
      exit(1);
   }

   strcpy ( inFileName, argv[1] );

   inFile = fopen ( inFileName, "rb" );
   if (inFile == NULL) {
      fprintf ( stderr, "%s: can't read `%s'\n", progName, inFileName );
      exit(1);
   }

   bsIn = bsOpenReadStream ( inFile );
   fprintf ( stderr, "%s: searching for block boundaries ...\n", progName );

   bitsRead = 0;
   buffHi = buffLo = 0;
   currBlock = 0;
   bStart[currBlock] = 0;

   rbCtr = 0;

   while (True) {
      b = bsGetBit ( bsIn );
      bitsRead++;
      if (b == 2) {
         if (bitsRead >= bStart[currBlock] &&
            (bitsRead - bStart[currBlock]) >= 40) {
            bEnd[currBlock] = bitsRead-1;
            if (currBlock > 0)
               fprintf ( stderr, "   block %d runs from " MaybeUInt64_FMT 
                                 " to " MaybeUInt64_FMT " (incomplete)\n",
                         currBlock,  bStart[currBlock], bEnd[currBlock] );
         } else
            currBlock--;
         break;
      }
      buffHi = (buffHi << 1) | (buffLo >> 31);
      buffLo = (buffLo << 1) | (b & 1);
      if ( ( (buffHi & 0x0000ffff) == BLOCK_HEADER_HI 
             && buffLo == BLOCK_HEADER_LO)
           || 
           ( (buffHi & 0x0000ffff) == BLOCK_ENDMARK_HI 
             && buffLo == BLOCK_ENDMARK_LO)
         ) {
         if (bitsRead > 49) {
            bEnd[currBlock] = bitsRead-49;
         } else {
            bEnd[currBlock] = 0;
         }
         if (currBlock > 0 &&
	     (bEnd[currBlock] - bStart[currBlock]) >= 130) {
            fprintf ( stderr, "   block %d runs from " MaybeUInt64_FMT 
                              " to " MaybeUInt64_FMT "\n",
                      rbCtr+1,  bStart[currBlock], bEnd[currBlock] );
            rbStart[rbCtr] = bStart[currBlock];
            rbEnd[rbCtr] = bEnd[currBlock];
            rbCtr++;
         }
         if (currBlock >= BZ_MAX_HANDLED_BLOCKS)
            tooManyBlocks(BZ_MAX_HANDLED_BLOCKS);
         currBlock++;

         bStart[currBlock] = bitsRead;
      }
   }

   bsClose ( bsIn );

   /*-- identified blocks run from 1 to rbCtr inclusive. --*/

   if (rbCtr < 1) {
      fprintf ( stderr,
                "%s: sorry, I couldn't find any block boundaries.\n",
                progName );
      exit(1);
   };

   fprintf ( stderr, "%s: splitting into blocks\n", progName );

   inFile = fopen ( inFileName, "rb" );
   if (inFile == NULL) {
      fprintf ( stderr, "%s: can't open `%s'\n", progName, inFileName );
      exit(1);
   }
   bsIn = bsOpenReadStream ( inFile );

   /*-- placate gcc's dataflow analyser --*/
   blockCRC = 0; bsWr = 0;

   bitsRead = 0;
   outFile = NULL;
   wrBlock = 0;
   while (True) {
      b = bsGetBit(bsIn);
      if (b == 2) break;
      buffHi = (buffHi << 1) | (buffLo >> 31);
      buffLo = (buffLo << 1) | (b & 1);
      if (bitsRead == 47+rbStart[wrBlock]) 
         blockCRC = (buffHi << 16) | (buffLo >> 16);

      if (outFile != NULL && bitsRead >= rbStart[wrBlock]
                          && bitsRead <= rbEnd[wrBlock]) {
         bsPutBit ( bsWr, b );
      }

      bitsRead++;

      if (bitsRead == rbEnd[wrBlock]+1) {
         if (outFile != NULL) {
            bsPutUChar ( bsWr, 0x17 ); bsPutUChar ( bsWr, 0x72 );
            bsPutUChar ( bsWr, 0x45 ); bsPutUChar ( bsWr, 0x38 );
            bsPutUChar ( bsWr, 0x50 ); bsPutUChar ( bsWr, 0x90 );
            bsPutUInt32 ( bsWr, blockCRC );
            bsClose ( bsWr );
         }
         if (wrBlock >= rbCtr) break;
         wrBlock++;
      } else
      if (bitsRead == rbStart[wrBlock]) {
         /* Create the output file name, correctly handling leading paths. 
            (31.10.2001 by Sergey E. Kusikov) */
         Char* split;
         Int32 ofs, k;
         for (k = 0; k < BZ_MAX_FILENAME; k++) 
            outFileName[k] = 0;
         strcpy (outFileName, inFileName);
         split = strrchr (outFileName, BZ_SPLIT_SYM);
         if (split == NULL) {
            split = outFileName;
         } else {
            ++split;
	 }
	 /* Now split points to the start of the basename. */
         ofs  = split - outFileName;
         sprintf (split, "rec%5d", wrBlock+1);
         for (p = split; *p != 0; p++) if (*p == ' ') *p = '0';
         strcat (outFileName, inFileName + ofs);

         if ( !endsInBz2(outFileName)) strcat ( outFileName, ".bz2" );

         fprintf ( stderr, "   writing block %d to `%s' ...\n",
                           wrBlock+1, outFileName );

         outFile = fopen ( outFileName, "wb" );
         if (outFile == NULL) {
            fprintf ( stderr, "%s: can't write `%s'\n",
                      progName, outFileName );
            exit(1);
         }
         bsWr = bsOpenWriteStream ( outFile );
         bsPutUChar ( bsWr, BZ_HDR_B );    
         bsPutUChar ( bsWr, BZ_HDR_Z );    
         bsPutUChar ( bsWr, BZ_HDR_h );    
         bsPutUChar ( bsWr, BZ_HDR_0 + 9 );
         bsPutUChar ( bsWr, 0x31 ); bsPutUChar ( bsWr, 0x41 );
         bsPutUChar ( bsWr, 0x59 ); bsPutUChar ( bsWr, 0x26 );
         bsPutUChar ( bsWr, 0x53 ); bsPutUChar ( bsWr, 0x59 );
      }
   }

   fprintf ( stderr, "%s: finished\n", progName );
   return 0;
}